

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

iterator * __thiscall
idx2::Insert<unsigned_long,idx2::chunk_meta_info>
          (iterator *__return_storage_ptr__,idx2 *this,
          hash_table<unsigned_long,_idx2::chunk_meta_info> *Ht,unsigned_long *Key,
          chunk_meta_info *Val)

{
  unsigned_long *puVar1;
  long lVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  unsigned_long uVar7;
  unsigned_long uVar8;
  unsigned_long uVar9;
  unsigned_long uVar10;
  unsigned_long uVar11;
  unsigned_long uVar12;
  unsigned_long uVar13;
  byte bVar14;
  long lVar15;
  ulong uVar16;
  
  bVar14 = (byte)*(undefined8 *)(this + 0x20);
  if (7L << (bVar14 & 0x3f) <= *(long *)(this + 0x18) * 10) {
    IncreaseCapacity<unsigned_long,idx2::chunk_meta_info>
              ((hash_table<unsigned_long,_idx2::chunk_meta_info> *)this);
    bVar14 = (byte)*(undefined8 *)(this + 0x20);
  }
  puVar1 = Ht->Keys;
  uVar16 = (ulong)((long)puVar1 * -0x61c8864680b583eb) >> (-bVar14 & 0x3f);
  if (*(char *)(*(long *)(this + 0x10) + uVar16) == '\x02') {
    do {
      if (*(unsigned_long **)(*(long *)this + uVar16 * 8) == puVar1) break;
      uVar16 = uVar16 + 1 & ~(-1L << (bVar14 & 0x3f));
    } while (*(char *)(*(long *)(this + 0x10) + uVar16) == '\x02');
  }
  *(unsigned_long **)(*(long *)this + uVar16 * 8) = puVar1;
  lVar2 = *(long *)(this + 8);
  lVar15 = uVar16 * 0x60;
  uVar3 = *Key;
  uVar4 = Key[1];
  uVar5 = Key[2];
  uVar6 = Key[3];
  uVar7 = Key[4];
  uVar8 = Key[5];
  uVar9 = Key[6];
  uVar10 = Key[7];
  uVar11 = Key[9];
  uVar12 = Key[10];
  uVar13 = Key[0xb];
  puVar1 = (unsigned_long *)(lVar2 + 0x40 + lVar15);
  *puVar1 = Key[8];
  puVar1[1] = uVar11;
  puVar1[2] = uVar12;
  puVar1[3] = uVar13;
  puVar1 = (unsigned_long *)(lVar2 + 0x20 + lVar15);
  *puVar1 = uVar7;
  puVar1[1] = uVar8;
  puVar1[2] = uVar9;
  puVar1[3] = uVar10;
  puVar1 = (unsigned_long *)(lVar2 + lVar15);
  *puVar1 = uVar3;
  puVar1[1] = uVar4;
  puVar1[2] = uVar5;
  puVar1[3] = uVar6;
  if (*(char *)(*(long *)(this + 0x10) + uVar16) != '\x02') {
    *(long *)(this + 0x18) = *(long *)(this + 0x18) + 1;
    *(undefined1 *)(*(long *)(this + 0x10) + uVar16) = 2;
  }
  __return_storage_ptr__->Key = (unsigned_long *)(uVar16 * 8 + *(long *)this);
  __return_storage_ptr__->Val = (chunk_meta_info *)(lVar15 + *(long *)(this + 8));
  __return_storage_ptr__->Ht = (hash_table<unsigned_long,_idx2::chunk_meta_info> *)this;
  __return_storage_ptr__->Idx = uVar16;
  return __return_storage_ptr__;
}

Assistant:

typename hash_table<k, v>::iterator
Insert(hash_table<k, v>* Ht, const k& Key, const v& Val)
{
  if (Size(*Ht) * 10 >= Capacity(*Ht) * 7)
    IncreaseCapacity(Ht);

  i64 H = Index(*Ht, Hash(Key));
  while (Ht->Stats[H] == hash_table<k, v>::Occupied && !(Ht->Keys[H] == Key))
  {
    ++H;
    H &= Capacity(*Ht) - 1;
  }

  Ht->Keys[H] = Key;
  Ht->Vals[H] = Val;
  if (Ht->Stats[H] != hash_table<k, v>::Occupied)
  {
    ++Ht->Size;
    Ht->Stats[H] = hash_table<k, v>::Occupied;
  }

  return IterAt(*Ht, H);
}